

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Types.h
# Opt level: O0

void __thiscall glslang::TType::TType(TType *this,TBasicType t,TType *p,TString *n)

{
  char *s;
  TString *pTVar1;
  anon_union_8_2_8ac53c11_for_TType_13 aVar2;
  ulong uVar3;
  void *__child_stack;
  undefined4 in_register_00000034;
  __fn *__fn;
  void *in_R8;
  TString *n_local;
  TType *p_local;
  TBasicType t_local;
  TType *this_local;
  undefined4 extraout_var;
  
  __fn = (__fn *)CONCAT44(in_register_00000034,t);
  this->_vptr_TType = (_func_int **)&PTR__TType_013a9620;
  *(TBasicType *)&this->field_0x8 = *(TBasicType *)&this->field_0x8 & 0xffffff00 | t & 0xff;
  *(uint *)&this->field_0x8 = *(uint *)&this->field_0x8 & 0xfffff0ff | 0x100;
  *(uint *)&this->field_0x8 = *(uint *)&this->field_0x8 & 0xffff0fff;
  *(uint *)&this->field_0x8 = *(uint *)&this->field_0x8 & 0xfff0ffff;
  *(uint *)&this->field_0x8 = *(uint *)&this->field_0x8 & 0xffefffff;
  *(uint *)&this->field_0x8 = *(uint *)&this->field_0x8 & 0xffdfffff;
  *(uint *)&this->field_0x8 = *(uint *)&this->field_0x8 & 0xffbfffff;
  *(uint *)&this->field_0x8 = *(uint *)&this->field_0x8 & 0xfc7fffff;
  *(uint *)&this->field_0x8 = *(uint *)&this->field_0x8 & 0xfbffffff;
  this->arraySizes = (TArraySizes *)0x0;
  (this->field_13).structure = (TTypeList *)0x0;
  this->fieldName = (TString *)0x0;
  this->typeName = (TString *)0x0;
  this->typeParameters = (TTypeParameters *)0x0;
  this->spirvType = (TSpirvType *)0x0;
  if (t == EbtReference) {
    s = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
        c_str(n);
    pTVar1 = NewPoolTString_abi_cxx11_(s);
    this->typeName = pTVar1;
    TSampler::clear(&this->sampler);
    TQualifier::clear(&this->qualifier);
    __child_stack = (void *)(ulong)((uint)*(undefined8 *)&(p->qualifier).field_0x8 & 0x7f);
    uVar3 = *(ulong *)&(this->qualifier).field_0x8 & 0xffffffffffffff80 | (ulong)__child_stack;
    *(ulong *)&(this->qualifier).field_0x8 = uVar3;
    aVar2._0_4_ = clone(p,__fn,__child_stack,(int)uVar3,in_R8);
    aVar2._4_4_ = extraout_var;
    this->field_13 = aVar2;
    return;
  }
  __assert_fail("t == EbtReference",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/../Include/Types.h"
                ,0x6bc,"glslang::TType::TType(TBasicType, const TType &, const TString &)");
}

Assistant:

explicit TType(TBasicType t, const TType &p, const TString& n) :
                            basicType(t), vectorSize(1), matrixCols(0), matrixRows(0), vector1(false), coopmatNV(false), coopmatKHR(false), coopmatKHRuse(0), coopmatKHRUseValid(false),
                            arraySizes(nullptr), structure(nullptr), fieldName(nullptr), typeName(nullptr), typeParameters(nullptr),
                            spirvType(nullptr)
                            {
                                assert(t == EbtReference);
                                typeName = NewPoolTString(n.c_str());
                                sampler.clear();
                                qualifier.clear();
                                qualifier.storage = p.qualifier.storage;
                                referentType = p.clone();
                            }